

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::DWARFUnit::getAddrOffsetSectionItem
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,DWARFUnit *this,
          uint32_t Index)

{
  bool bVar1;
  uint32_t uVar2;
  DWARFSection *pDVar3;
  uint32_t uVar4;
  byte bVar5;
  uint8_t AddressSize;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__x;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar6;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar7;
  pointer this_00;
  size_t sVar8;
  DWARFObject *Obj;
  SectionedAddress local_80;
  uint64_t local_70;
  uint64_t Address;
  uint64_t Section;
  DWARFDataExtractor DA;
  uint64_t Offset;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *I;
  unit_iterator_range R;
  uint32_t Index_local;
  DWARFUnit *this_local;
  
  R.end_iterator._4_4_ = Index;
  if ((this->IsDWO & 1U) != 0) {
    _I = DWARFContext::info_section_units(this->Context);
    __x = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
          ::begin((iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                   *)&I);
    puVar6 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
             ::end((iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                    *)&I);
    if (__x != puVar6) {
      puVar6 = std::next<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
                         (__x,1);
      puVar7 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
               ::end((iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                      *)&I);
      if (puVar6 == puVar7) {
        this_00 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::
                  operator->(__x);
        getAddrOffsetSectionItem(__return_storage_ptr__,this_00,R.end_iterator._4_4_);
        return __return_storage_ptr__;
      }
    }
  }
  uVar4 = R.end_iterator._4_4_;
  uVar2 = this->AddrOffsetSectionBase;
  bVar5 = getAddressByteSize(this);
  DA.Section = (DWARFSection *)(ulong)(uVar2 + uVar4 * bVar5);
  sVar8 = StringRef::size(&this->AddrOffsetSection->Data);
  pDVar3 = DA.Section;
  bVar5 = getAddressByteSize(this);
  if (sVar8 < (long)&(pDVar3->Data).Data + (ulong)bVar5) {
    Optional<llvm::object::SectionedAddress>::Optional(__return_storage_ptr__,None);
  }
  else {
    Obj = DWARFContext::getDWARFObj(this->Context);
    pDVar3 = this->AddrOffsetSection;
    bVar1 = this->isLittleEndian;
    AddressSize = getAddressByteSize(this);
    DWARFDataExtractor::DWARFDataExtractor
              ((DWARFDataExtractor *)&Section,Obj,pDVar3,(bool)(bVar1 & 1),AddressSize);
    local_80.Address =
         DWARFDataExtractor::getRelocatedAddress
                   ((DWARFDataExtractor *)&Section,(uint64_t *)&DA.Section,&Address);
    local_80.SectionIndex = Address;
    local_70 = local_80.Address;
    Optional<llvm::object::SectionedAddress>::Optional(__return_storage_ptr__,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<object::SectionedAddress>
DWARFUnit::getAddrOffsetSectionItem(uint32_t Index) const {
  if (IsDWO) {
    auto R = Context.info_section_units();
    auto I = R.begin();
    // Surprising if a DWO file has more than one skeleton unit in it - this
    // probably shouldn't be valid, but if a use case is found, here's where to
    // support it (probably have to linearly search for the matching skeleton CU
    // here)
    if (I != R.end() && std::next(I) == R.end())
      return (*I)->getAddrOffsetSectionItem(Index);
  }
  uint64_t Offset = AddrOffsetSectionBase + Index * getAddressByteSize();
  if (AddrOffsetSection->Data.size() < Offset + getAddressByteSize())
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), *AddrOffsetSection,
                        isLittleEndian, getAddressByteSize());
  uint64_t Section;
  uint64_t Address = DA.getRelocatedAddress(&Offset, &Section);
  return {{Address, Section}};
}